

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads_kernel_2.h
# Opt level: O3

void __thiscall dlib::mutex::mutex(mutex *this)

{
  int iVar1;
  error *this_00;
  string local_40;
  
  iVar1 = pthread_mutex_init((pthread_mutex_t *)this,(pthread_mutexattr_t *)0x0);
  if (iVar1 == 0) {
    return;
  }
  this_00 = (error *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"in function mutex::mutex() an error occurred making the mutex","")
  ;
  error::error(this_00,ECREATE_MUTEX,&local_40);
  *(undefined ***)this_00 = &PTR__error_001fa880;
  __cxa_throw(this_00,&thread_error::typeinfo,error::~error);
}

Assistant:

mutex (
        )
        { 
            if (pthread_mutex_init(&myMutex,0)) 
            {
                throw dlib::thread_error(ECREATE_MUTEX,
        "in function mutex::mutex() an error occurred making the mutex"
                );      
            }
        }